

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTendon::IfcTendon(IfcTendon *this)

{
  IfcTendon *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x220,"IfcTendon");
  Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            (&this->super_IfcReinforcingElement,&PTR_construction_vtable_24__0105d1f0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTendon,_8UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTendon,_8UL> *)
             &(this->super_IfcReinforcingElement).field_0x190,&PTR_construction_vtable_24__0105d3d0)
  ;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x105d070;
  *(undefined8 *)&this->field_0x220 = 0x105d1d8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x105d098;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x105d0c0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x105d0e8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x105d110;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0x105d138;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x105d160;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = 0x105d188;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x190 = 0x105d1b0;
  std::__cxx11::string::string((string *)&(this->super_IfcReinforcingElement).field_0x1a0);
  STEP::Maybe<double>::Maybe(&this->TensionForce);
  STEP::Maybe<double>::Maybe(&this->PreStress);
  STEP::Maybe<double>::Maybe(&this->FrictionCoefficient);
  STEP::Maybe<double>::Maybe(&this->AnchorageSlip);
  STEP::Maybe<double>::Maybe(&this->MinCurvatureRadius);
  return;
}

Assistant:

IfcTendon() : Object("IfcTendon") {}